

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

int mqc_mpsexchange(opj_mqc_t *mqc)

{
  int d;
  opj_mqc_t *mqc_local;
  
  if (mqc->a < (*mqc->curctx)->qeval) {
    d = 1 - (*mqc->curctx)->mps;
    *mqc->curctx = (*mqc->curctx)->nlps;
  }
  else {
    d = (*mqc->curctx)->mps;
    *mqc->curctx = (*mqc->curctx)->nmps;
  }
  return d;
}

Assistant:

static INLINE int mqc_mpsexchange(opj_mqc_t *const mqc) {
	int d;
	if (mqc->a < (*mqc->curctx)->qeval) {
		d = 1 - (*mqc->curctx)->mps;
		*mqc->curctx = (*mqc->curctx)->nlps;
	} else {
		d = (*mqc->curctx)->mps;
		*mqc->curctx = (*mqc->curctx)->nmps;
	}
	
	return d;
}